

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O0

void __thiscall testinator::TestRegistry::Unregister(TestRegistry *this,Test *test)

{
  bool bVar1;
  mapped_type *__x;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>
  *i;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  range;
  string *suiteName;
  string *testName;
  Test *test_local;
  TestRegistry *this_local;
  
  testName = (string *)test;
  test_local = (Test *)this;
  __x = ::std::
        map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->m_testNames,(key_type *)&testName);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::erase(&this->m_tests,__x);
  ::std::
  map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(&this->m_testNames,(key_type *)&testName);
  range.second._M_node =
       (_Base_ptr)
       ::std::
       map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator[](&this->m_suiteNames,(key_type *)&testName);
  _i = ::std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
       ::equal_range(&this->m_testsBySuite,(key_type *)range.second._M_node);
  do {
    bVar1 = ::std::operator!=((_Self *)&i,&range.first);
    if (!bVar1) {
LAB_001f3789:
      ::std::
      map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&this->m_suiteNames,(key_type *)&testName);
      return;
    }
    ppVar2 = ::std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>
             ::operator->((_Self *)&i);
    if (ppVar2->second == (Test *)testName) {
      ::std::
      multimap<std::__cxx11::string,testinator::Test*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
      ::erase_abi_cxx11_((multimap<std::__cxx11::string,testinator::Test*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
                          *)&this->m_testsBySuite,(iterator)i);
      goto LAB_001f3789;
    }
    ::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>
    ::operator++((_Self *)&i);
  } while( true );
}

Assistant:

void Unregister(Test* test)
    {
      const std::string& testName = m_testNames[test];
      m_tests.erase(testName);
      m_testNames.erase(test);

      const std::string& suiteName = m_suiteNames[test];
      auto range = m_testsBySuite.equal_range(suiteName);
      for (auto& i = range.first; i != range.second; ++i)
      {
        if (i->second == test)
        {
          m_testsBySuite.erase(i);
          break;
        }
      }
      m_suiteNames.erase(test);
    }